

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ssse3.c
# Opt level: O2

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong auStack_bb8 [16];
  ulong auStack_b38 [16];
  ulong auStack_ab8 [16];
  ulong auStack_a38 [16];
  ulong auStack_9b8 [16];
  ulong auStack_938 [16];
  ulong auStack_8b8 [16];
  block *local_838;
  block blockR;
  block block_tmp;
  
  auStack_8b8[9] = 0x117eff;
  memcpy(&blockR,ref_block,0x400);
  auStack_8b8[9] = 0x117f0a;
  xor_block(&blockR,prev_block);
  auStack_8b8[9] = 0x117f1f;
  memcpy(&block_tmp,&blockR,0x400);
  if (with_xor != 0) {
    auStack_8b8[9] = 0x117f33;
    xor_block(&block_tmp,next_block);
  }
  for (lVar12 = 0x78; lVar12 != 0x478; lVar12 = lVar12 + 0x80) {
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar12 + 0x30);
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x10);
    lVar2 = *(long *)((long)auStack_8b8 + lVar12 + 0x18);
    uVar13 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + uVar10 + lVar1;
    uVar4 = *(ulong *)((long)auStack_8b8 + lVar12 + 0x70) ^ uVar13;
    uVar3 = uVar4 >> 0x20;
    uVar4 = uVar4 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x50);
    uVar7 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar4 + lVar1;
    uVar3 = (uVar10 ^ uVar7) >> 0x18;
    auStack_8b8[0xf] = (uVar10 ^ uVar7) << 0x28 | uVar3;
    uVar14 = (uVar13 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xf] + uVar13;
    uVar4 = uVar4 ^ uVar14;
    uVar10 = uVar4 >> 0x10;
    auStack_8b8[0xc] = uVar4 << 0x30 | uVar10;
    uVar8 = (uVar7 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xc] + uVar7;
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar12 + 0x38);
    uVar13 = (lVar2 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + uVar10 + lVar2;
    uVar4 = *(ulong *)((long)auStack_8b8 + lVar12 + 0x78) ^ uVar13;
    uVar3 = uVar4 >> 0x20;
    uVar4 = uVar4 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x58);
    uVar7 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar4 + lVar1;
    uVar3 = (uVar10 ^ uVar7) >> 0x18;
    uVar5 = (uVar10 ^ uVar7) << 0x28 | uVar3;
    uVar11 = (uVar13 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar5 + uVar13;
    uVar4 = uVar4 ^ uVar11;
    uVar3 = uVar4 >> 0x10;
    auStack_8b8[0xd] = uVar4 << 0x30 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x20);
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar12 + 0x40);
    uVar17 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + lVar1 + uVar10;
    uVar13 = *(ulong *)((long)blockR.v + lVar12 + -8) ^ uVar17;
    uVar4 = uVar13 >> 0x20;
    uVar13 = uVar13 << 0x20 | uVar4;
    uVar9 = (uVar7 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xd] + uVar7;
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x60);
    uVar4 = (lVar1 * 2 & 0x1fffffffeU) * uVar4 + uVar13 + lVar1;
    uVar3 = (uVar10 ^ uVar4) >> 0x18;
    uVar6 = (uVar10 ^ uVar4) << 0x28 | uVar3;
    uVar18 = (uVar17 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar17 + uVar6;
    uVar13 = uVar13 ^ uVar18;
    uVar10 = uVar13 >> 0x10;
    auStack_8b8[0xe] = uVar13 << 0x30 | uVar10;
    uVar13 = (uVar4 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xe] + uVar4;
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x28);
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar12 + 0x48);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + lVar1 + uVar10;
    uVar4 = *(ulong *)((long)blockR.v + lVar12) ^ uVar16;
    uVar3 = uVar4 >> 0x20;
    uVar17 = uVar4 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar12 + 0x68);
    uVar7 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar17 + lVar1;
    uVar4 = (uVar10 ^ uVar7) >> 0x18;
    uVar15 = (uVar10 ^ uVar7) << 0x28 | uVar4;
    uVar5 = uVar5 ^ uVar9;
    uVar10 = uVar5 << 1;
    uVar3 = (ulong)((long)uVar5 < 0);
    uVar5 = uVar10 | uVar3;
    uVar16 = (uVar16 * 2 & 0x1fffffffe) * (uVar4 & 0xffffffff) + uVar16 + uVar15;
    uVar17 = uVar17 ^ uVar16;
    uVar4 = uVar17 >> 0x10;
    uVar17 = uVar17 << 0x30 | uVar4;
    auStack_8b8[0xb] = uVar17 + uVar7;
    uVar14 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar5 + uVar14;
    uVar6 = uVar6 ^ uVar13;
    uVar17 = uVar17 ^ uVar14;
    uVar10 = uVar17 >> 0x20;
    uVar17 = uVar17 << 0x20 | uVar10;
    uVar3 = (uVar13 * 2 & 0x1fffffffe) * uVar10 + uVar17 + uVar13;
    uVar5 = uVar5 ^ uVar3;
    uVar10 = uVar5 >> 0x18;
    uVar13 = uVar5 << 0x28 | uVar10;
    uVar4 = (uVar7 * 2 & 0x1fffffffe) * (uVar4 & 0xffffffff) + auStack_8b8[0xb];
    uVar7 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar13 + uVar14;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x10) = uVar7;
    uVar7 = uVar7 ^ uVar17;
    uVar10 = uVar7 >> 0x10;
    uVar7 = uVar7 << 0x30 | uVar10;
    *(ulong *)((long)blockR.v + lVar12) = uVar7;
    uVar7 = (uVar3 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar7 + uVar3;
    uVar10 = uVar6 << 1;
    uVar3 = (ulong)((long)uVar6 < 0);
    uVar17 = uVar10 | uVar3;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x60) = uVar7;
    uVar7 = uVar7 ^ uVar13;
    uVar15 = uVar15 ^ uVar4;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x38) = uVar7 << 1 | (ulong)((long)uVar7 < 0);
    uVar13 = (uVar11 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar11 + uVar17;
    uVar10 = (auStack_8b8[0xc] ^ uVar13) >> 0x20;
    uVar5 = (auStack_8b8[0xc] ^ uVar13) << 0x20 | uVar10;
    uVar3 = (uVar4 * 2 & 0x1fffffffe) * uVar10 + uVar4 + uVar5;
    uVar17 = uVar17 ^ uVar3;
    uVar10 = uVar17 >> 0x18;
    uVar7 = uVar17 << 0x28 | uVar10;
    uVar4 = (uVar13 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar13 + uVar7;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x18) = uVar4;
    uVar4 = uVar4 ^ uVar5;
    uVar10 = uVar4 >> 0x10;
    uVar4 = uVar4 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x70) = uVar4;
    uVar4 = (uVar3 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar4 + uVar3;
    uVar10 = uVar15 << 1;
    uVar3 = (ulong)((long)uVar15 < 0);
    uVar17 = uVar10 | uVar3;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x68) = uVar4;
    uVar4 = uVar4 ^ uVar7;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x40) = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    uVar3 = (uVar18 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar18 + uVar17;
    uVar10 = (auStack_8b8[0xd] ^ uVar3) >> 0x20;
    uVar4 = (auStack_8b8[0xd] ^ uVar3) << 0x20 | uVar10;
    uVar13 = (uVar8 * 2 & 0x1fffffffe) * uVar10 + uVar4 + uVar8;
    uVar17 = uVar17 ^ uVar13;
    uVar10 = uVar17 >> 0x18;
    uVar5 = uVar17 << 0x28 | uVar10;
    uVar17 = (uVar3 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar3 + uVar5;
    uVar10 = (auStack_8b8[0xf] ^ uVar8) << 1;
    uVar3 = (ulong)((long)(auStack_8b8[0xf] ^ uVar8) < 0);
    uVar7 = uVar10 | uVar3;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x20) = uVar17;
    uVar17 = uVar17 ^ uVar4;
    uVar4 = uVar17 >> 0x10;
    uVar17 = uVar17 << 0x30 | uVar4;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x78) = uVar17;
    uVar4 = (uVar13 * 2 & 0x1fffffffe) * (uVar4 & 0xffffffff) + uVar17 + uVar13;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x50) = uVar4;
    uVar6 = (uVar16 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar16 + uVar7;
    uVar10 = (auStack_8b8[0xe] ^ uVar6) >> 0x20;
    uVar17 = (auStack_8b8[0xe] ^ uVar6) << 0x20 | uVar10;
    uVar4 = uVar4 ^ uVar5;
    uVar13 = (uVar9 * 2 & 0x1fffffffe) * uVar10 + uVar17 + uVar9;
    uVar7 = uVar7 ^ uVar13;
    uVar10 = uVar7 >> 0x18;
    uVar3 = uVar7 << 0x28 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x48) = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    uVar4 = (uVar6 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar3 + uVar6;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x28) = uVar4;
    uVar4 = uVar4 ^ uVar17;
    uVar10 = uVar4 >> 0x10;
    uVar4 = uVar4 << 0x30 | uVar10;
    *(ulong *)((long)blockR.v + lVar12 + -8) = uVar4;
    uVar10 = (uVar13 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar4 + uVar13;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x58) = uVar10;
    uVar10 = uVar10 ^ uVar3;
    *(ulong *)((long)auStack_8b8 + lVar12 + 0x30) = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  }
  for (lVar12 = 0x388; lVar12 != 0x408; lVar12 = lVar12 + 0x10) {
    uVar10 = *(ulong *)((long)auStack_ab8 + lVar12);
    lVar1 = *(long *)((long)auStack_bb8 + lVar12 + 8);
    uVar13 = (*(long *)((long)auStack_bb8 + lVar12) * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) +
             uVar10 + *(long *)((long)auStack_bb8 + lVar12);
    uVar4 = *(ulong *)((long)auStack_8b8 + lVar12) ^ uVar13;
    uVar3 = uVar4 >> 0x20;
    uVar4 = uVar4 << 0x20 | uVar3;
    uVar7 = (*(long *)((long)auStack_9b8 + lVar12) * 2 & 0x1fffffffeU) * uVar3 +
            uVar4 + *(long *)((long)auStack_9b8 + lVar12);
    uVar3 = (uVar10 ^ uVar7) >> 0x18;
    auStack_8b8[0xf] = (uVar10 ^ uVar7) << 0x28 | uVar3;
    uVar14 = (uVar13 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xf] + uVar13;
    uVar4 = uVar4 ^ uVar14;
    uVar10 = uVar4 >> 0x10;
    auStack_8b8[0xc] = uVar4 << 0x30 | uVar10;
    uVar8 = (uVar7 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xc] + uVar7;
    uVar10 = *(ulong *)((long)auStack_ab8 + lVar12 + 8);
    uVar13 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + uVar10 + lVar1;
    uVar4 = *(ulong *)((long)auStack_8b8 + lVar12 + 8) ^ uVar13;
    uVar3 = uVar4 >> 0x20;
    uVar4 = uVar4 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_9b8 + lVar12 + 8);
    uVar7 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar4 + lVar1;
    uVar3 = (uVar10 ^ uVar7) >> 0x18;
    uVar5 = (uVar10 ^ uVar7) << 0x28 | uVar3;
    uVar11 = (uVar13 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar5 + uVar13;
    uVar4 = uVar4 ^ uVar11;
    uVar3 = uVar4 >> 0x10;
    auStack_8b8[0xd] = uVar4 << 0x30 | uVar3;
    uVar10 = *(ulong *)((long)auStack_a38 + lVar12);
    uVar17 = (*(long *)((long)auStack_b38 + lVar12) * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) +
             *(long *)((long)auStack_b38 + lVar12) + uVar10;
    uVar13 = *(ulong *)((long)blockR.v + lVar12 + -8) ^ uVar17;
    uVar4 = uVar13 >> 0x20;
    uVar13 = uVar13 << 0x20 | uVar4;
    uVar9 = (uVar7 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xd] + uVar7;
    uVar4 = (*(long *)((long)auStack_938 + lVar12) * 2 & 0x1fffffffeU) * uVar4 +
            uVar13 + *(long *)((long)auStack_938 + lVar12);
    uVar3 = (uVar10 ^ uVar4) >> 0x18;
    uVar6 = (uVar10 ^ uVar4) << 0x28 | uVar3;
    uVar18 = (uVar17 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar17 + uVar6;
    uVar13 = uVar13 ^ uVar18;
    uVar10 = uVar13 >> 0x10;
    auStack_8b8[0xe] = uVar13 << 0x30 | uVar10;
    uVar13 = (uVar4 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xe] + uVar4;
    lVar1 = *(long *)((long)auStack_b38 + lVar12 + 8);
    uVar10 = *(ulong *)((long)auStack_a38 + lVar12 + 8);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + lVar1 + uVar10;
    uVar4 = *(ulong *)((long)blockR.v + lVar12) ^ uVar16;
    uVar3 = uVar4 >> 0x20;
    uVar17 = uVar4 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_938 + lVar12 + 8);
    uVar7 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar17 + lVar1;
    uVar4 = (uVar10 ^ uVar7) >> 0x18;
    uVar15 = (uVar10 ^ uVar7) << 0x28 | uVar4;
    uVar5 = uVar5 ^ uVar9;
    uVar10 = uVar5 << 1;
    uVar3 = (ulong)((long)uVar5 < 0);
    uVar5 = uVar10 | uVar3;
    uVar16 = (uVar16 * 2 & 0x1fffffffe) * (uVar4 & 0xffffffff) + uVar16 + uVar15;
    uVar17 = uVar17 ^ uVar16;
    uVar4 = uVar17 >> 0x10;
    uVar17 = uVar17 << 0x30 | uVar4;
    auStack_8b8[0xb] = uVar17 + uVar7;
    uVar14 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar5 + uVar14;
    uVar6 = uVar6 ^ uVar13;
    uVar17 = uVar17 ^ uVar14;
    uVar10 = uVar17 >> 0x20;
    uVar17 = uVar17 << 0x20 | uVar10;
    uVar3 = (uVar13 * 2 & 0x1fffffffe) * uVar10 + uVar17 + uVar13;
    uVar5 = uVar5 ^ uVar3;
    uVar10 = uVar5 >> 0x18;
    uVar13 = uVar5 << 0x28 | uVar10;
    uVar4 = (uVar7 * 2 & 0x1fffffffe) * (uVar4 & 0xffffffff) + auStack_8b8[0xb];
    uVar7 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar13 + uVar14;
    *(ulong *)((long)auStack_bb8 + lVar12) = uVar7;
    uVar7 = uVar7 ^ uVar17;
    uVar10 = uVar7 >> 0x10;
    uVar7 = uVar7 << 0x30 | uVar10;
    *(ulong *)((long)blockR.v + lVar12) = uVar7;
    uVar7 = (uVar3 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar7 + uVar3;
    uVar10 = uVar6 << 1;
    uVar3 = (ulong)((long)uVar6 < 0);
    uVar17 = uVar10 | uVar3;
    *(ulong *)((long)auStack_938 + lVar12) = uVar7;
    uVar7 = uVar7 ^ uVar13;
    uVar15 = uVar15 ^ uVar4;
    *(ulong *)((long)auStack_ab8 + lVar12 + 8) = uVar7 << 1 | (ulong)((long)uVar7 < 0);
    uVar13 = (uVar11 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar11 + uVar17;
    uVar10 = (auStack_8b8[0xc] ^ uVar13) >> 0x20;
    uVar5 = (auStack_8b8[0xc] ^ uVar13) << 0x20 | uVar10;
    uVar3 = (uVar4 * 2 & 0x1fffffffe) * uVar10 + uVar4 + uVar5;
    uVar17 = uVar17 ^ uVar3;
    uVar10 = uVar17 >> 0x18;
    uVar7 = uVar17 << 0x28 | uVar10;
    uVar4 = (uVar13 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar13 + uVar7;
    *(ulong *)((long)auStack_bb8 + lVar12 + 8) = uVar4;
    uVar4 = uVar4 ^ uVar5;
    uVar10 = uVar4 >> 0x10;
    uVar4 = uVar4 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar12) = uVar4;
    uVar4 = (uVar3 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar4 + uVar3;
    uVar10 = uVar15 << 1;
    uVar3 = (ulong)((long)uVar15 < 0);
    uVar17 = uVar10 | uVar3;
    *(ulong *)((long)auStack_938 + lVar12 + 8) = uVar4;
    uVar4 = uVar4 ^ uVar7;
    *(ulong *)((long)auStack_a38 + lVar12) = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    uVar3 = (uVar18 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar18 + uVar17;
    uVar10 = (auStack_8b8[0xd] ^ uVar3) >> 0x20;
    uVar4 = (auStack_8b8[0xd] ^ uVar3) << 0x20 | uVar10;
    uVar13 = (uVar8 * 2 & 0x1fffffffe) * uVar10 + uVar4 + uVar8;
    uVar17 = uVar17 ^ uVar13;
    uVar10 = uVar17 >> 0x18;
    uVar5 = uVar17 << 0x28 | uVar10;
    uVar17 = (uVar3 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar3 + uVar5;
    uVar10 = (auStack_8b8[0xf] ^ uVar8) << 1;
    uVar3 = (ulong)((long)(auStack_8b8[0xf] ^ uVar8) < 0);
    uVar7 = uVar10 | uVar3;
    *(ulong *)((long)auStack_b38 + lVar12) = uVar17;
    uVar17 = uVar17 ^ uVar4;
    uVar4 = uVar17 >> 0x10;
    uVar17 = uVar17 << 0x30 | uVar4;
    *(ulong *)((long)auStack_8b8 + lVar12 + 8) = uVar17;
    uVar4 = (uVar13 * 2 & 0x1fffffffe) * (uVar4 & 0xffffffff) + uVar17 + uVar13;
    *(ulong *)((long)auStack_9b8 + lVar12) = uVar4;
    uVar6 = (uVar16 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar3) + uVar16 + uVar7;
    uVar10 = (auStack_8b8[0xe] ^ uVar6) >> 0x20;
    uVar17 = (auStack_8b8[0xe] ^ uVar6) << 0x20 | uVar10;
    uVar4 = uVar4 ^ uVar5;
    uVar13 = (uVar9 * 2 & 0x1fffffffe) * uVar10 + uVar17 + uVar9;
    uVar7 = uVar7 ^ uVar13;
    uVar10 = uVar7 >> 0x18;
    uVar3 = uVar7 << 0x28 | uVar10;
    *(ulong *)((long)auStack_a38 + lVar12 + 8) = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    uVar4 = (uVar6 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar3 + uVar6;
    *(ulong *)((long)auStack_b38 + lVar12 + 8) = uVar4;
    uVar4 = uVar4 ^ uVar17;
    uVar10 = uVar4 >> 0x10;
    uVar4 = uVar4 << 0x30 | uVar10;
    *(ulong *)((long)blockR.v + lVar12 + -8) = uVar4;
    uVar10 = (uVar13 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar4 + uVar13;
    *(ulong *)((long)auStack_9b8 + lVar12 + 8) = uVar10;
    uVar10 = uVar10 ^ uVar3;
    *(ulong *)((long)auStack_ab8 + lVar12) = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  }
  auStack_8b8[9] = 0x118881;
  local_838 = next_block;
  memcpy(next_block,&block_tmp,0x400);
  auStack_8b8[9] = 0x11888e;
  xor_block(next_block,&blockR);
  return;
}

Assistant:

static void fill_block(__m128i* state, const block* ref_block,
	block* next_block, int with_xor) {
	__m128i block_XY[ARGON2_OWORDS_IN_BLOCK];
	unsigned int i;

	if (with_xor) {
		for (i = 0; i < ARGON2_OWORDS_IN_BLOCK; i++) {
			state[i] = _mm_xor_si128(
				state[i], _mm_loadu_si128((const __m128i*)ref_block->v + i));
			block_XY[i] = _mm_xor_si128(
				state[i], _mm_loadu_si128((const __m128i*)next_block->v + i));
		}
	}
	else {
		for (i = 0; i < ARGON2_OWORDS_IN_BLOCK; i++) {
			block_XY[i] = state[i] = _mm_xor_si128(
				state[i], _mm_loadu_si128((const __m128i*)ref_block->v + i));
		}
	}

	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND(state[8 * i + 0], state[8 * i + 1], state[8 * i + 2],
			state[8 * i + 3], state[8 * i + 4], state[8 * i + 5],
			state[8 * i + 6], state[8 * i + 7]);
	}

	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND(state[8 * 0 + i], state[8 * 1 + i], state[8 * 2 + i],
			state[8 * 3 + i], state[8 * 4 + i], state[8 * 5 + i],
			state[8 * 6 + i], state[8 * 7 + i]);
	}

	for (i = 0; i < ARGON2_OWORDS_IN_BLOCK; i++) {
		state[i] = _mm_xor_si128(state[i], block_XY[i]);
		_mm_storeu_si128((__m128i*)next_block->v + i, state[i]);
	}
}